

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

double __thiscall soplex::SPxScaler<double>::maxAbsColscale(SPxScaler<double> *this)

{
  DataArray<int> *pDVar1;
  double dVar2;
  ulong uVar3;
  int i;
  long lVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 local_28 [16];
  
  pDVar1 = this->m_activeColscaleExp;
  local_28 = ZEXT816(0);
  for (lVar4 = 0; lVar4 < pDVar1->thesize; lVar4 = lVar4 + 1) {
    dVar2 = ldexp(1.0,pDVar1->data[lVar4]);
    if ((double)local_28._0_8_ < ABS(dVar2)) {
      dVar2 = ldexp(1.0,pDVar1->data[lVar4]);
      uVar3 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) & 0x7fffffffffffffff;
      local_28._8_4_ = (int)uVar3;
      local_28._0_8_ = ABS(dVar2);
      local_28._12_4_ = (int)(uVar3 >> 0x20);
    }
  }
  return (double)local_28._0_8_;
}

Assistant:

R SPxScaler<R>::maxAbsColscale() const
{
   const DataArray < int >& colscaleExp = *m_activeColscaleExp;

   R maxi = 0.0;

   for(int i = 0; i < colscaleExp.size(); ++i)
      if(spxAbs(spxLdexp(1.0, colscaleExp[i])) > maxi)
         maxi = spxAbs(spxLdexp(1.0, colscaleExp[i]));


   return maxi;
}